

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O0

void __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::Forward
          (RecursiveMaximumLikelihoodParameterGeneration *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int *piVar5;
  reference pvVar6;
  int iVar7;
  long in_RDI;
  int u_4;
  double *k_2;
  int j_3;
  double tmp_2;
  double *c;
  int m_15;
  double *pv;
  int v;
  double *pu;
  int u_3;
  double *k_1;
  double *pi_2;
  int m_14;
  int u_2;
  double *k;
  double denominator;
  int j_2;
  double tmp_1;
  double *pi_1;
  int m_13;
  double *p;
  int j_1;
  double tmp;
  int u_1;
  double *pi;
  int m_12;
  int j;
  int m_11;
  bool update;
  double *window_coefficients;
  int half_window_width;
  int d;
  int m_10;
  int m_9;
  int m_8;
  double *static_and_dynamic_diagonal_covariance_matrix;
  int m_7;
  int m_6;
  double *static_and_dynamic_mean_vector;
  int t;
  int max_half_window_width;
  int m_5;
  int u;
  int m_4;
  int m_3;
  int m_2;
  int m_1;
  int m;
  int dynamic_size;
  int static_size;
  int num_delta;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe28;
  double *in_stack_fffffffffffffe30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe40;
  double dVar8;
  size_type in_stack_fffffffffffffe48;
  value_type vVar9;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  int local_18c;
  int local_17c;
  double local_178;
  int local_164;
  int local_158;
  int local_154;
  reference local_150;
  int local_144;
  reference local_140;
  reference local_138;
  int local_130;
  int local_12c;
  reference local_128;
  double local_120;
  int local_114;
  double local_110;
  reference local_108;
  int local_fc;
  reference local_f8;
  int local_ec;
  value_type local_e8;
  int local_dc;
  reference local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  byte local_c1;
  reference local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  double *local_a0;
  double *local_98;
  int local_8c;
  reference local_88;
  int local_80;
  int local_7c;
  reference local_78;
  int local_70;
  int local_6c;
  undefined8 local_68;
  double *local_60;
  double *local_58;
  int local_4c;
  undefined8 local_48;
  double *local_40;
  double *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x10));
  local_c = (int)sVar1;
  local_10 = *(int *)(in_RDI + 8) + 1;
  local_14 = local_10 * local_c;
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x58));
  if (sVar1 != (long)local_14) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x58),(long)local_18);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
  }
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x70));
  if (sVar1 != (long)local_14) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x70),(long)local_1c);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
  }
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x88));
  if (sVar1 != (long)local_10) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    for (local_20 = 0; local_20 < local_10; local_20 = local_20 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x88),(long)local_20);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
  }
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0xa0));
  if (sVar1 != (long)local_10) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    for (local_24 = 0; local_24 < local_10; local_24 = local_24 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0xa0),(long)local_24);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
  }
  sVar1 = std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::size((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  *)(in_RDI + 0xb8));
  if (sVar1 != (long)local_10) {
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::resize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    for (local_28 = 0; local_28 < local_10; local_28 = local_28 + 1) {
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    *)(in_RDI + 0xb8),(long)local_28);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x34); local_2c = local_2c + 1) {
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0xb8),(long)local_28);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](pvVar2,(long)local_2c);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0xb8),(long)local_28);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](pvVar2,(long)local_2c);
        local_38 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0xb8),(long)local_28);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](pvVar2,(long)local_2c);
        local_40 = (double *)
                   std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
        local_48 = 0;
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0xb8),(long)local_28);
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar2,(long)local_2c);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar3,(long)*(int *)(in_RDI + 0x34));
        *pvVar4 = 1.79769313486232e+308;
      }
    }
  }
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0xd0));
  if (sVar1 != (long)local_10) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    for (local_4c = 0; local_4c < local_10; local_4c = local_4c + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0xd0),(long)local_4c);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0xd0),(long)local_4c);
      local_58 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0xd0),(long)local_4c);
      local_60 = (double *)
                 std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
      local_68 = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    }
  }
  local_6c = (*(int *)(in_RDI + 0x34) - *(int *)(in_RDI + 0xc)) + -1;
  local_70 = (*(int *)(in_RDI + 0x3c) + local_6c) % *(int *)(in_RDI + 0x34);
  local_78 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),0);
  for (local_7c = 0; local_7c < local_10; local_7c = local_7c + 1) {
    vVar9 = local_78[local_7c];
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0xd0),(long)local_7c);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_70);
    *pvVar4 = vVar9;
  }
  for (local_80 = 0; local_80 < local_14; local_80 = local_80 + 1) {
    vVar9 = local_78[local_10 + local_80];
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x58),(long)local_80);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_70);
    *pvVar4 = vVar9;
  }
  local_88 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),
                        (long)(local_10 + local_14));
  for (local_8c = 0; local_8c < local_10; local_8c = local_8c + 1) {
    pvVar2 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           *)(in_RDI + 0xb8),(long)local_8c);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](pvVar2,(long)local_70);
    local_98 = (double *)
               std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
    pvVar2 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           *)(in_RDI + 0xb8),(long)local_8c);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](pvVar2,(long)local_70);
    local_a0 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
    local_a8 = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  }
  for (local_ac = 0; local_ac < local_10; local_ac = local_ac + 1) {
    vVar9 = local_88[local_ac];
    pvVar2 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           *)(in_RDI + 0xb8),(long)local_ac);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](pvVar2,(long)local_70);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar3,(long)*(int *)(in_RDI + 0x34));
    *pvVar4 = vVar9;
  }
  for (local_b0 = 0; local_b0 < local_14; local_b0 = local_b0 + 1) {
    vVar9 = local_88[local_10 + local_b0];
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x70),(long)local_b0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_70);
    *pvVar4 = vVar9;
  }
  local_b4 = 0;
  do {
    if (local_c <= local_b4) {
      *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + 1;
      return;
    }
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x10),(long)local_b4);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
    local_b8 = ((int)sVar1 + -1) / 2;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x10),(long)local_b4);
    local_c0 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_b8);
    local_c1 = 1;
    for (local_c8 = 0; local_c8 < local_10; local_c8 = local_c8 + 1) {
      for (local_cc = -local_b8; local_cc <= local_b8; local_cc = local_cc + 1) {
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0xb8),(long)local_c8);
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar2,(long)((*(int *)(in_RDI + 0x3c) + local_cc) %
                                           *(int *)(in_RDI + 0x34)));
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar3,(long)*(int *)(in_RDI + 0x34));
        if ((*pvVar4 == 1.79769313486232e+308) && (!NAN(*pvVar4))) {
          local_c1 = 0;
          break;
        }
      }
      if ((local_c1 & 1) == 0) break;
    }
    if ((local_c1 & 1) != 0) {
      for (local_d0 = 0; local_d0 < local_10; local_d0 = local_d0 + 1) {
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x88),(long)local_d0);
        local_d8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar3,(long)*(int *)(in_RDI + 0xc));
        for (local_dc = -*(int *)(in_RDI + 0xc); local_dc <= local_6c; local_dc = local_dc + 1) {
          local_e8 = 0.0;
          for (local_ec = -local_b8; local_ec <= local_b8; local_ec = local_ec + 1) {
            pvVar2 = std::
                     vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                   *)(in_RDI + 0xb8),(long)local_d0);
            pvVar3 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](pvVar2,(long)((*(int *)(in_RDI + 0x3c) + local_ec) %
                                               *(int *)(in_RDI + 0x34)));
            local_f8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar3,(long)*(int *)(in_RDI + 0x34));
            local_e8 = local_c0[local_ec] * local_f8[local_dc - local_ec] + local_e8;
          }
          local_d8[local_dc] = local_e8;
        }
      }
      for (local_fc = 0; local_fc < local_10; local_fc = local_fc + 1) {
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x88),(long)local_fc);
        local_108 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar3,(long)*(int *)(in_RDI + 0xc));
        local_110 = 0.0;
        for (local_114 = -local_b8; local_114 <= local_b8; local_114 = local_114 + 1) {
          local_110 = local_c0[local_114] * local_108[local_114] + local_110;
        }
        dVar8 = local_110;
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x70),(long)(local_10 * local_b4 + local_fc));
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar3,(long)(*(int *)(in_RDI + 0x3c) % *(int *)(in_RDI + 0x34)));
        local_120 = 1.0 / (dVar8 + *pvVar4);
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0xa0),(long)local_fc);
        local_128 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar3,(long)*(int *)(in_RDI + 0xc));
        for (local_12c = -*(int *)(in_RDI + 0xc); local_12c <= local_6c; local_12c = local_12c + 1)
        {
          local_128[local_12c] = local_108[local_12c] * local_120;
        }
      }
      for (local_130 = 0; local_130 < local_10; local_130 = local_130 + 1) {
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x88),(long)local_130);
        local_138 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar3,(long)*(int *)(in_RDI + 0xc));
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0xa0),(long)local_130);
        local_140 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar3,(long)*(int *)(in_RDI + 0xc));
        for (local_144 = -*(int *)(in_RDI + 0xc); local_144 <= local_6c; local_144 = local_144 + 1)
        {
          pvVar2 = std::
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                 *)(in_RDI + 0xb8),(long)local_130);
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](pvVar2,(long)((*(int *)(in_RDI + 0x3c) + local_144) %
                                             *(int *)(in_RDI + 0x34)));
          local_150 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar3,(long)*(int *)(in_RDI + 0x34));
          local_158 = -local_b8;
          piVar5 = std::max<int>(&local_144,&local_158);
          for (local_154 = *piVar5; local_154 <= local_6c; local_154 = local_154 + 1) {
            local_150[local_154 - local_144] =
                 -local_140[local_154] * local_138[local_144] + local_150[local_154 - local_144];
            if (local_154 != local_144) {
              pvVar2 = std::
                       vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                       ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                     *)(in_RDI + 0xb8),(long)local_130);
              pvVar3 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](pvVar2,(long)((*(int *)(in_RDI + 0x3c) + local_154) %
                                                 *(int *)(in_RDI + 0x34)));
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar3,(long)*(int *)(in_RDI + 0x34));
              pvVar4[local_144 - local_154] = local_150[local_154 - local_144];
            }
          }
        }
      }
      for (local_164 = 0; local_164 < local_10; local_164 = local_164 + 1) {
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0xd0),(long)local_164);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x58),(long)(local_10 * local_b4 + local_164));
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar3,(long)(*(int *)(in_RDI + 0x3c) % *(int *)(in_RDI + 0x34)));
        local_178 = *pvVar6;
        for (local_17c = -local_b8; local_17c <= local_b8; local_17c = local_17c + 1) {
          local_178 = -local_c0[local_17c] *
                      pvVar4[(*(int *)(in_RDI + 0x3c) + local_17c) % *(int *)(in_RDI + 0x34)] +
                      local_178;
        }
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0xa0),(long)local_164);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar3,(long)*(int *)(in_RDI + 0xc));
        for (local_18c = -*(int *)(in_RDI + 0xc); local_18c <= local_6c; local_18c = local_18c + 1)
        {
          iVar7 = (*(int *)(in_RDI + 0x3c) + local_18c) % *(int *)(in_RDI + 0x34);
          pvVar4[iVar7] = pvVar6[local_18c] * local_178 + pvVar4[iVar7];
        }
      }
    }
    local_b4 = local_b4 + 1;
  } while( true );
}

Assistant:

void RecursiveMaximumLikelihoodParameterGeneration::Forward() {
  const int num_delta(static_cast<int>(window_coefficients_.size()));
  const int static_size(num_order_ + 1);
  const int dynamic_size(static_size * num_delta);

  // Prepare memories.
  {
    if (buffer_.stored_dynamic_mean_vectors.size() !=
        static_cast<std::size_t>(dynamic_size)) {
      buffer_.stored_dynamic_mean_vectors.resize(dynamic_size);
      for (int m(0); m < dynamic_size; ++m) {
        buffer_.stored_dynamic_mean_vectors[m].resize(calculation_field_);
      }
    }

    if (buffer_.stored_dynamic_diagonal_covariance_matrices.size() !=
        static_cast<std::size_t>(dynamic_size)) {
      buffer_.stored_dynamic_diagonal_covariance_matrices.resize(dynamic_size);
      for (int m(0); m < dynamic_size; ++m) {
        buffer_.stored_dynamic_diagonal_covariance_matrices[m].resize(
            calculation_field_);
      }
    }

    if (buffer_.pi.size() != static_cast<std::size_t>(static_size)) {
      buffer_.pi.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.pi[m].resize(calculation_field_);
      }
    }

    if (buffer_.k.size() != static_cast<std::size_t>(static_size)) {
      buffer_.k.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.k[m].resize(calculation_field_);
      }
    }

    if (buffer_.p.size() != static_cast<std::size_t>(static_size)) {
      buffer_.p.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.p[m].resize(calculation_field_);
        for (int u(0); u < calculation_field_; ++u) {
          buffer_.p[m][u].resize(2 * calculation_field_ + 1);
          std::fill(buffer_.p[m][u].begin(), buffer_.p[m][u].end(), 0.0);
          buffer_.p[m][u][calculation_field_] = kInf;
        }
      }
    }

    if (buffer_.c.size() != static_cast<std::size_t>(static_size)) {
      buffer_.c.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.c[m].resize(calculation_field_);
        std::fill(buffer_.c[m].begin(), buffer_.c[m].end(), 0.0);
      }
    }
  }

  // Copy inputs.
  const int max_half_window_width(calculation_field_ - num_past_frame_ - 1);
  {
    const int t((current_frame_ + max_half_window_width) % calculation_field_);

    const double* static_and_dynamic_mean_vector(
        &(buffer_.static_and_dynamic_parameters[0]));
    for (int m(0); m < static_size; ++m) {
      buffer_.c[m][t] = static_and_dynamic_mean_vector[m];
    }
    for (int m(0); m < dynamic_size; ++m) {
      buffer_.stored_dynamic_mean_vectors[m][t] =
          static_and_dynamic_mean_vector[static_size + m];
    }

    const double* static_and_dynamic_diagonal_covariance_matrix(
        &(buffer_.static_and_dynamic_parameters[static_size + dynamic_size]));
    for (int m(0); m < static_size; ++m) {
      std::fill(buffer_.p[m][t].begin(), buffer_.p[m][t].end(), 0.0);
    }
    for (int m(0); m < static_size; ++m) {
      buffer_.p[m][t][calculation_field_] =
          static_and_dynamic_diagonal_covariance_matrix[m];
    }
    for (int m(0); m < dynamic_size; ++m) {
      buffer_.stored_dynamic_diagonal_covariance_matrices[m][t] =
          static_and_dynamic_diagonal_covariance_matrix[static_size + m];
    }
  }

  for (int d(0); d < num_delta; ++d) {
    const int half_window_width(
        (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
    const double* window_coefficients(
        &(window_coefficients_[d][half_window_width]));

    // Do not update state if given variance is infinite.
    bool update(true);
    for (int m(0); m < static_size; ++m) {
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        if (kInf == buffer_.p[m][(current_frame_ + j) % calculation_field_]
                             [calculation_field_]) {
          update = false;
          break;
        }
      }
      if (!update) break;
    }
    if (!update) continue;

    // Calculate the numerator of Kalman gain.
    for (int m(0); m < static_size; ++m) {
      double* pi(&buffer_.pi[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        double tmp(0.0);
        for (int j(-half_window_width); j <= half_window_width; ++j) {
          const double* p(
              &buffer_.p[m][(current_frame_ + j) % calculation_field_]
                        [calculation_field_]);
          tmp += window_coefficients[j] * p[u - j];
        }
        pi[u] = tmp;
      }
    }

    // Calculate Kalman gain.
    for (int m(0); m < static_size; ++m) {
      const double* pi(&buffer_.pi[m][num_past_frame_]);
      double tmp(0.0);
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        tmp += window_coefficients[j] * pi[j];
      }

      const double denominator(
          1.0 /
          (tmp +
           buffer_.stored_dynamic_diagonal_covariance_matrices
               [static_size * d + m][current_frame_ % calculation_field_]));
      double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        k[u] = pi[u] * denominator;
      }
    }

    // Update error covariance.
    for (int m(0); m < static_size; ++m) {
      const double* pi(&buffer_.pi[m][num_past_frame_]);
      const double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        double* pu(&buffer_.p[m][(current_frame_ + u) % calculation_field_]
                             [calculation_field_]);
        for (int v(std::max(u, -half_window_width)); v <= max_half_window_width;
             ++v) {
          pu[v - u] -= k[v] * pi[u];
          if (v != u) {
            double* pv(&buffer_.p[m][(current_frame_ + v) % calculation_field_]
                                 [calculation_field_]);
            pv[u - v] = pu[v - u];
          }
        }
      }
    }

    // Update state estimates.
    for (int m(0); m < static_size; ++m) {
      double* c(&buffer_.c[m][0]);
      double tmp(buffer_.stored_dynamic_mean_vectors[static_size * d + m]
                                                    [current_frame_ %
                                                     calculation_field_]);
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        tmp -= window_coefficients[j] *
               c[(current_frame_ + j) % calculation_field_];
      }

      const double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        c[(current_frame_ + u) % calculation_field_] += k[u] * tmp;
      }
    }
  }

  ++current_frame_;
}